

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O3

int csp_eth_rx(csp_iface_t *iface,csp_eth_header_t *eth_frame,uint32_t received_len,int *task_woken)

{
  csp_eth_interface_data_t *ifdata;
  uint uVar1;
  int iVar2;
  csp_packet_t *packet;
  ulong uVar3;
  char *pcVar4;
  ushort uVar5;
  ushort uVar6;
  
  ifdata = (csp_eth_interface_data_t *)iface->interface_data;
  if (eth_debug) {
    csp_hex_dump("rx",eth_frame,received_len);
  }
  if ((eth_frame->ether_type != 0xb588) || (received_len < 0x16)) {
    iface->frame = iface->frame + 1;
    return -2;
  }
  uVar5 = eth_frame->seg_size << 8 | eth_frame->seg_size >> 8;
  if ((ushort)(uVar5 - 0x5dd) < 0xfa24) {
    iface->frame = iface->frame + 1;
    pcVar4 = "eth rx seg_size of %u bytes is invalid\n";
    goto LAB_0010e009;
  }
  uVar6 = eth_frame->packet_length << 8 | eth_frame->packet_length >> 8;
  if (uVar6 < uVar5) {
    iface->frame = iface->frame + 1;
    uVar3 = (ulong)uVar6;
    pcVar4 = "eth rx seg_size(%u) > frame_length(%u)\n";
  }
  else {
    if ((ushort)(uVar5 + 0x16) <= received_len) {
      if (0x100 < uVar6) {
        iface->frame = iface->frame + 1;
        csp_print_func("eth rx frame_length of %u is invalid\n",(ulong)(uint)uVar6);
        return -2;
      }
      packet = csp_eth_pbuf_find(ifdata,CONCAT22(eth_frame->packet_id,eth_frame->src_addr),
                                 task_woken);
      if (packet == (csp_packet_t *)0x0) {
        iface->drop = iface->drop + 1;
        pcVar4 = "eth rx cannot get csp packet\n";
      }
      else {
        if (packet->frame_length == 0) {
          csp_id_setup_rx(packet);
          packet->frame_length = uVar6;
          packet->rx_count = 0;
        }
        else if (uVar6 != packet->frame_length) {
          csp_eth_pbuf_free(ifdata,packet,1,task_woken);
          iface->frame = iface->frame + 1;
          pcVar4 = "eth rx inconsistent frame_length\n";
          goto LAB_0010e009;
        }
        uVar1 = (uint)packet->rx_count + (uint)uVar5;
        if (uVar1 < uVar6 || uVar1 == uVar6) {
          memcpy(packet->frame_begin + packet->rx_count,eth_frame + 1,(ulong)uVar5);
          uVar5 = uVar5 + packet->rx_count;
          packet->rx_count = uVar5;
          if (uVar5 < packet->frame_length) {
            return 0;
          }
          csp_eth_pbuf_free(ifdata,packet,0,task_woken);
          iVar2 = csp_id_strip(packet);
          if (iVar2 != 0) {
            csp_print_func("eth rx packet discarded due to error in ID field\n");
            iface->frame = iface->frame + 1;
            if (task_woken != (int *)0x0) {
              csp_buffer_free_isr(packet);
              return -2;
            }
            csp_buffer_free(packet);
            return -2;
          }
          csp_eth_arp_set_addr(eth_frame->ether_shost,(packet->id).src);
          if (((packet->id).dst == iface->addr) || (ifdata->promisc != false)) {
            csp_qfifo_write(packet,iface,task_woken);
          }
          else {
            csp_eth_pbuf_free(ifdata,packet,1,task_woken);
            if (task_woken == (int *)0x0) {
              csp_buffer_free(packet);
            }
            else {
              csp_buffer_free_isr(packet);
            }
          }
          return 0;
        }
        csp_eth_pbuf_free(ifdata,packet,1,task_woken);
        iface->frame = iface->frame + 1;
        pcVar4 = "eth rx data received exceeds frame_length\n";
      }
LAB_0010e009:
      csp_print_func(pcVar4);
      return -2;
    }
    iface->frame = iface->frame + 1;
    pcVar4 = "eth rx sizeof(csp_eth_frame_t) + seg_size(%u) > received(%u)\n";
    uVar3 = (ulong)received_len;
  }
  csp_print_func(pcVar4,(ulong)uVar5,uVar3);
  return -2;
}

Assistant:

int csp_eth_rx(csp_iface_t * iface, csp_eth_header_t * eth_frame, uint32_t received_len, int * task_woken) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    if (eth_debug) csp_hex_dump("rx", (void*)eth_frame, received_len);

    /* Filter on CSP protocol id */
    if ((be16toh(eth_frame->ether_type) != CSP_ETH_TYPE_CSP)) {
        iface->frame++;
        return CSP_ERR_INVAL;
    }

    if (received_len < sizeof(csp_eth_header_t)) {
        iface->frame++;
        return CSP_ERR_INVAL;
    }

    /* Packet ID on RX side is a concatenation of packet ID on TX side and the source address */
    uint32_t packet_id = 0;
    uint16_t seg_size = 0;
    uint16_t frame_length = 0;
    csp_if_eth_unpack_header(eth_frame, &packet_id, &seg_size, &frame_length);

    if (seg_size == 0 || seg_size > CSP_ETH_FRAME_SIZE_MAX) {
        iface->frame++;
        csp_print("eth rx seg_size of %u bytes is invalid\n");
        return CSP_ERR_INVAL;
    }

    if (seg_size > frame_length) {
        iface->frame++;
        csp_print("eth rx seg_size(%u) > frame_length(%u)\n", (unsigned)seg_size, (unsigned)frame_length);
        return CSP_ERR_INVAL;
    }

    if ((sizeof(csp_eth_header_t) + seg_size) > received_len) {
        iface->frame++;
        csp_print("eth rx sizeof(csp_eth_frame_t) + seg_size(%u) > received(%u)\n",
            (unsigned)seg_size, (unsigned)received_len);
        return CSP_ERR_INVAL;
    }

    if (frame_length == 0 || frame_length > CSP_BUFFER_SIZE) {
        iface->frame++;
        csp_print("eth rx frame_length of %u is invalid\n", frame_length);
        return CSP_ERR_INVAL;
    }

    csp_packet_t * packet = csp_eth_pbuf_find(ifdata, packet_id, task_woken);

    if (packet == NULL) {
        iface->drop++;
        csp_print("eth rx cannot get csp packet\n");
        return CSP_ERR_INVAL;
    }

    if (packet->frame_length == 0) {
        /* First segment */
        csp_id_setup_rx(packet);
        packet->frame_length = frame_length;
        packet->rx_count = 0;
    }

    if (frame_length != packet->frame_length) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        iface->frame++;
        csp_print("eth rx inconsistent frame_length\n");
        return CSP_ERR_INVAL;
    }

    if ((packet->rx_count + seg_size) > packet->frame_length) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        iface->frame++;
        csp_print("eth rx data received exceeds frame_length\n");
        return CSP_ERR_INVAL;
    }

    memcpy(packet->frame_begin + packet->rx_count, eth_frame->frame_begin, seg_size);
    packet->rx_count += seg_size;

    /* Send packet when fully received */
    if (packet->rx_count < packet->frame_length) {
        return CSP_ERR_NONE;
    }

    csp_eth_pbuf_free(ifdata, packet, false, task_woken);

    if (csp_id_strip(packet) != 0) {
        csp_print("eth rx packet discarded due to error in ID field\n");
        iface->frame++;
        (task_woken) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
        return CSP_ERR_INVAL;
    }

    /* Record CSP and MAC addresses of source */
    csp_eth_arp_set_addr(eth_frame->ether_shost, packet->id.src);

    if (packet->id.dst != iface->addr && !ifdata->promisc) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        (task_woken) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
        return CSP_ERR_NONE;
    }

    csp_qfifo_write(packet, iface, task_woken);

    return CSP_ERR_NONE;
}